

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

int __thiscall
alex::
AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
insert_using_shifts(AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                    *this,double *key,double payload,int pos)

{
  int pos_00;
  double *pdVar1;
  double *pdVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  uVar3 = closest_gap(this,pos);
  if ((-1 < (int)uVar3) && ((int)uVar3 < this->data_capacity_)) {
    this->bitmap_[uVar3 >> 6] = this->bitmap_[uVar3 >> 6] | 1L << ((ulong)uVar3 & 0x3f);
    iVar6 = uVar3 - pos;
    if ((int)uVar3 < pos) {
      pos_00 = pos + -1;
      if ((int)uVar3 < pos_00) {
        pdVar1 = this->payload_slots_;
        pdVar2 = this->key_slots_;
        lVar4 = 0;
        do {
          pdVar2[(ulong)uVar3 + lVar4] = pdVar2[(ulong)uVar3 + lVar4 + 1];
          pdVar1[(ulong)uVar3 + lVar4] = pdVar1[(ulong)uVar3 + lVar4 + 1];
          lVar4 = lVar4 + 1;
        } while ((int)(uVar3 + (int)lVar4) < pos_00);
      }
      insert_element_at(this,key,payload,pos_00);
      iVar6 = ~uVar3 + pos;
      pos = pos_00;
    }
    else {
      if (iVar6 != 0 && pos <= (int)uVar3) {
        pdVar1 = this->key_slots_;
        pdVar2 = this->payload_slots_;
        uVar5 = (ulong)uVar3;
        do {
          pdVar1[uVar5] = pdVar1[uVar5 - 1];
          pdVar2[uVar5] = pdVar2[uVar5 - 1];
          uVar5 = uVar5 - 1;
        } while ((long)pos < (long)uVar5);
      }
      insert_element_at(this,key,payload,pos);
    }
    this->num_shifts_ = this->num_shifts_ + (long)iVar6;
    return pos;
  }
  __assert_fail("pos >= 0 && pos < data_capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex_nodes.h"
                ,0x1e4,
                "void alex::AlexDataNode<double, double>::set_bit(int) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
               );
}

Assistant:

int insert_using_shifts(const T& key, P payload, int pos) {
    // Find the closest gap
    int gap_pos = closest_gap(pos);
    set_bit(gap_pos);
    if (gap_pos >= pos) {
      for (int i = gap_pos; i > pos; i--) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        key_slots_[i] = key_slots_[i - 1];
        payload_slots_[i] = payload_slots_[i - 1];
#else
        data_slots_[i] = data_slots_[i - 1];
#endif
      }
      insert_element_at(key, payload, pos);
      num_shifts_ += gap_pos - pos;
      return pos;
    } else {
      for (int i = gap_pos; i < pos - 1; i++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        key_slots_[i] = key_slots_[i + 1];
        payload_slots_[i] = payload_slots_[i + 1];
#else
        data_slots_[i] = data_slots_[i + 1];
#endif
      }
      insert_element_at(key, payload, pos - 1);
      num_shifts_ += pos - gap_pos - 1;
      return pos - 1;
    }
  }